

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

axbStatus_t op_mat_csr_tvec(axbMat_s *A,axbVec_s *x,axbVec_s *ATx,void *aux_data)

{
  double dVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  size_t i;
  size_t sVar10;
  long lVar11;
  
  sVar3 = A->cols;
  pvVar4 = A->row_markers;
  pvVar5 = A->col_indices;
  pvVar6 = A->values;
  pvVar7 = x->data;
  pvVar8 = ATx->data;
  for (sVar10 = 0; sVar3 != sVar10; sVar10 = sVar10 + 1) {
    *(undefined8 *)((long)pvVar8 + sVar10 * 8) = 0;
  }
  sVar3 = A->rows;
  sVar10 = 0;
  while (sVar10 != sVar3) {
    dVar1 = *(double *)((long)pvVar7 + sVar10 * 8);
    lVar11 = sVar10 * 4;
    iVar2 = *(int *)((long)pvVar4 + sVar10 * 4 + 4);
    sVar10 = sVar10 + 1;
    for (lVar11 = (long)*(int *)((long)pvVar4 + lVar11); lVar11 < iVar2; lVar11 = lVar11 + 1) {
      lVar9 = (long)*(int *)((long)pvVar5 + lVar11 * 4);
      *(double *)((long)pvVar8 + lVar9 * 8) =
           *(double *)((long)pvVar6 + lVar11 * 8) * dVar1 + *(double *)((long)pvVar8 + lVar9 * 8);
    }
  }
  return 0;
}

Assistant:

static axbStatus_t op_mat_csr_tvec(struct axbMat_s *A, struct axbVec_s *x, struct axbVec_s *ATx, void *aux_data)
{
  (void)aux_data;

  const int    *A_row_markers = (const int*)A->row_markers;
  const int    *A_col_indices = (const int*)A->col_indices;
  const double *A_values      = (const double*)A->values;
  const double *d_x           = (const double*)x->data;

  double *d_ATx = (double*)ATx->data;

  for (size_t i=0; i<A->cols; ++i) d_ATx[i] = 0;

  for (size_t i=0; i<A->rows; ++i) {
    double xi = d_x[i];
    for (int j=A_row_markers[i]; j < A_row_markers[i+1]; ++j) {
      d_ATx[A_col_indices[j]] += A_values[j] * xi;
    }
  }

  return 0;
}